

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O0

size_t __thiscall Messages::Person_PhoneNumber::ByteSizeLong(Person_PhoneNumber *this)

{
  bool bVar1;
  Person_PhoneType value;
  int size;
  string *value_00;
  size_t sVar2;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  Person_PhoneNumber *this_local;
  
  _cached_size = (Person_PhoneNumber *)0x0;
  bVar1 = _internal_has_number(this);
  if (bVar1) {
    value_00 = _internal_number_abi_cxx11_(this);
    sVar2 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
    _cached_size = (Person_PhoneNumber *)(sVar2 + 1);
  }
  if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
    value = _internal_type(this);
    sVar2 = google::protobuf::internal::WireFormatLite::EnumSize(value);
    _cached_size = (Person_PhoneNumber *)
                   ((long)(_cached_size->_has_bits_).has_bits_ + (sVar2 - 0xf));
  }
  if (((uint)*(undefined8 *)&this->field_0x8 & 1) == 1) {
    this_local = (Person_PhoneNumber *)
                 google::protobuf::internal::ComputeUnknownFieldsSize
                           ((InternalMetadata *)&this->field_0x8,(ulong)_cached_size,
                            &this->_cached_size_);
  }
  else {
    size = google::protobuf::internal::ToCachedSize((size_t)_cached_size);
    SetCachedSize(this,size);
    this_local = _cached_size;
  }
  return (size_t)this_local;
}

Assistant:

size_t Person_PhoneNumber::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:Messages.Person.PhoneNumber)
  size_t total_size = 0;

  // required string number = 1;
  if (_internal_has_number()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_number());
  }
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // optional .Messages.Person.PhoneType type = 2 [default = HOME];
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000002u) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}